

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

bool __thiscall
brotli::HashLongestMatchQuickly<17,_4,_true>::FindLongestMatch
          (HashLongestMatchQuickly<17,_4,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t backward_reference_offset;
  double dVar10;
  uint32_t off;
  double score_1;
  size_t backward_1;
  size_t word_id;
  size_t transform_id;
  size_t matchlen;
  size_t offset;
  uint32_t dist;
  uint32_t len_2;
  uint16_t v;
  uint32_t dict_key;
  double score;
  size_t len_1;
  size_t backward;
  uint32_t *puStack_88;
  int i;
  uint32_t *bucket;
  size_t len;
  ulong uStack_70;
  bool match_found;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  double best_score;
  int compare_char;
  uint32_t key;
  size_t cur_ix_masked;
  size_t best_len_in;
  size_t max_length_local;
  size_t cur_ix_local;
  int *distance_cache_local;
  size_t ring_buffer_mask_local;
  uint8_t *ring_buffer_local;
  HashLongestMatchQuickly<17,_4,_true> *this_local;
  
  cached_backward = *best_len_out;
  uVar7 = cur_ix & ring_buffer_mask;
  uVar4 = HashBytes(ring_buffer + uVar7);
  uVar1 = ring_buffer[uVar7 + cached_backward];
  best_len = (size_t)*best_score_out;
  iVar3 = *distance_cache;
  uVar8 = cur_ix - (long)iVar3;
  len._7_1_ = false;
  if ((uVar8 < cur_ix) &&
     (uVar8 = ring_buffer_mask & 0xffffffff & uVar8, uVar1 == ring_buffer[uVar8 + cached_backward]))
  {
    sVar9 = FindMatchLengthWithLimit(ring_buffer + uVar8,ring_buffer + uVar7,max_length);
    len._7_1_ = 3 < sVar9;
    if (len._7_1_) {
      best_len = (size_t)BackwardReferenceScoreUsingLastDistance(sVar9,0);
      *best_len_out = sVar9;
      *best_len_code_out = sVar9;
      *best_distance_out = (long)iVar3;
      *best_score_out = (double)best_len;
      uVar1 = ring_buffer[uVar7 + sVar9];
      cached_backward = sVar9;
    }
  }
  puStack_88 = this->buckets_ + uVar4;
  uVar6 = *puStack_88;
  backward._4_4_ = 0;
  while( true ) {
    uStack_70 = (ulong)uVar6;
    puStack_88 = puStack_88 + 1;
    if (3 < backward._4_4_) break;
    uVar8 = cur_ix - uStack_70;
    uStack_70 = ring_buffer_mask & 0xffffffff & uStack_70;
    if (((uVar1 == ring_buffer[uStack_70 + cached_backward]) &&
        (uVar8 != 0 && uVar8 <= max_backward)) &&
       ((sVar9 = FindMatchLengthWithLimit(ring_buffer + uStack_70,ring_buffer + uVar7,max_length),
        3 < sVar9 && (dVar10 = BackwardReferenceScore(sVar9,uVar8), (double)best_len < dVar10)))) {
      *best_len_out = sVar9;
      *best_len_code_out = sVar9;
      *best_distance_out = uVar8;
      *best_score_out = dVar10;
      uVar1 = ring_buffer[uVar7 + sVar9];
      len._7_1_ = true;
      cached_backward = sVar9;
      best_len = (size_t)dVar10;
    }
    backward._4_4_ = backward._4_4_ + 1;
    uVar6 = *puStack_88;
  }
  if ((len._7_1_ == false) && (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_)) {
    this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
    uVar5 = Hash<14>(ring_buffer + uVar7);
    uVar2 = *(ushort *)(kStaticDictionaryHash + (ulong)(uVar5 << 1) * 2);
    if (uVar2 != 0) {
      uVar6 = uVar2 & 0x1f;
      if (((uVar6 <= max_length) &&
          (sVar9 = FindMatchLengthWithLimit
                             (ring_buffer + uVar7,
                              kBrotliDictionary +
                              (kBrotliDictionaryOffsetsByLength[uVar6] +
                              uVar6 * ((int)(uint)uVar2 >> 5)),(ulong)uVar6),
          (ulong)uVar6 < sVar9 + 10)) && (sVar9 != 0)) {
        backward_reference_offset =
             max_backward +
             (ulong)(byte)kCutoffTransforms[uVar6 - sVar9] * (long)(1 << (""[uVar6] & 0x1f)) +
             (ulong)(uint)((int)(uint)uVar2 >> 5) + 1;
        dVar10 = BackwardReferenceScore(sVar9,backward_reference_offset);
        if ((double)best_len < dVar10) {
          this->num_dict_matches_ = this->num_dict_matches_ + 1;
          *best_len_out = sVar9;
          *best_len_code_out = (ulong)uVar6;
          *best_distance_out = backward_reference_offset;
          *best_score_out = dVar10;
          len._7_1_ = true;
        }
      }
    }
  }
  this->buckets_[uVar4 + ((uint)(cur_ix >> 3) & 3)] = (uint32_t)cur_ix;
  return len._7_1_;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }